

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O0

Image * deqp::gls::fboc::details::makeImage
                  (GLenum bufType,ImageFormat format,GLsizei width,GLsizei height,
                  FboBuilder *builder)

{
  undefined8 local_38;
  Image *image;
  FboBuilder *builder_local;
  GLsizei height_local;
  GLsizei width_local;
  GLenum bufType_local;
  ImageFormat format_local;
  
  local_38._0_4_ = 0;
  local_38._4_4_ = 0;
  if (bufType == 0) {
    format_local.format = 0;
    format_local.unsizedType = 0;
  }
  else {
    if (bufType == 0x1702) {
      local_38 = (ImageFormat)
                 FboUtil::FboBuilder::makeConfig<deqp::gls::FboUtil::config::Texture2D>(builder);
    }
    else if (bufType == 0x8d41) {
      local_38 = (ImageFormat)
                 FboUtil::FboBuilder::makeConfig<deqp::gls::FboUtil::config::Renderbuffer>(builder);
    }
    *(ImageFormat *)((long)local_38 + 8) = format;
    *(GLsizei *)((long)local_38 + 0x10) = width;
    *(GLsizei *)((long)local_38 + 0x14) = height;
    format_local = local_38;
  }
  return (Image *)format_local;
}

Assistant:

Image* makeImage (GLenum bufType, ImageFormat format,
				  GLsizei width, GLsizei height, FboBuilder& builder)
{
	Image* image = DE_NULL;
	switch (bufType)
	{
		case GL_NONE:
			return DE_NULL;
		case GL_RENDERBUFFER:
			image = &builder.makeConfig<Renderbuffer>();
			break;
		case GL_TEXTURE:
			image = &builder.makeConfig<Texture2D>();
			break;
		default:
			DE_FATAL("Impossible case");
	}
	image->internalFormat = format;
	image->width = width;
	image->height = height;
	return image;
}